

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_idwt53_h(opj_dwt_t *dwt,OPJ_INT32 *tiledp)

{
  int *piVar1;
  OPJ_INT32 *__src;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  lVar8 = (long)dwt->sn;
  uVar2 = dwt->dn + dwt->sn;
  if (dwt->cas == 0) {
    if (1 < (int)uVar2) {
      __src = dwt->mem;
      iVar3 = tiledp[lVar8];
      iVar4 = *tiledp - (iVar3 + 1 >> 1);
      if ((int)uVar2 < 4) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        iVar7 = iVar3;
        iVar6 = iVar4;
        do {
          iVar3 = *(int *)((long)tiledp + uVar9 * 2 + lVar8 * 4 + 4);
          iVar4 = *(int *)((long)tiledp + uVar9 * 2 + 4) - (iVar7 + iVar3 + 2 >> 2);
          __src[uVar9] = iVar6;
          __src[uVar9 + 1] = (iVar6 + iVar4 >> 1) + iVar7;
          uVar9 = uVar9 + 2;
          iVar7 = iVar3;
          iVar6 = iVar4;
        } while ((ulong)(uVar2 - 4 & 0xfffffffe) + 2 != uVar9);
        uVar9 = uVar9 & 0xffffffff;
      }
      __src[uVar9] = iVar4;
      lVar8 = -4;
      if ((uVar2 & 1) != 0) {
        iVar7 = tiledp[uVar2 - 1 >> 1] - (iVar3 + 1 >> 1);
        __src[uVar2 - 1] = iVar7;
        iVar4 = iVar7 + iVar4 >> 1;
        lVar8 = -8;
      }
      *(int *)((long)__src + lVar8 + (ulong)uVar2 * 4) = iVar4 + iVar3;
LAB_0010c77f:
      memcpy(tiledp,__src,(ulong)uVar2 << 2);
      return;
    }
  }
  else if (uVar2 == 2) {
    piVar1 = dwt->mem;
    iVar3 = *tiledp - (tiledp[lVar8] + 1 >> 1);
    piVar1[1] = iVar3;
    *piVar1 = iVar3 + tiledp[lVar8];
    *(undefined8 *)tiledp = *(undefined8 *)piVar1;
  }
  else if (uVar2 == 1) {
    *tiledp = *tiledp / 2;
  }
  else if (2 < (int)uVar2) {
    __src = dwt->mem;
    iVar3 = tiledp[lVar8 + 1];
    iVar4 = *tiledp - (iVar3 + tiledp[lVar8] + 2 >> 2);
    *__src = tiledp[lVar8] + iVar4;
    uVar5 = uVar2 & 1 ^ 1;
    uVar9 = 1;
    if (1 < (int)((uVar2 - 2) - uVar5)) {
      lVar10 = 0;
      iVar7 = iVar3;
      iVar6 = iVar4;
      do {
        iVar3 = *(int *)((long)tiledp + lVar10 * 2 + lVar8 * 4 + 8);
        iVar4 = *(int *)((long)tiledp + lVar10 * 2 + 4) - (iVar7 + iVar3 + 2 >> 2);
        __src[lVar10 + 1] = iVar6;
        __src[lVar10 + 2] = (iVar6 + iVar4 >> 1) + iVar7;
        lVar10 = lVar10 + 2;
        iVar7 = iVar3;
        iVar6 = iVar4;
      } while ((ulong)((uVar2 - uVar5) - 4 & 0xfffffffe) + 2 != lVar10);
      uVar9 = (ulong)((int)lVar10 + 1);
    }
    __src[uVar9] = iVar4;
    if ((uVar2 & 1) == 0) {
      iVar7 = tiledp[(ulong)(uVar2 >> 1) - 1] - (iVar3 + 1 >> 1);
      __src[uVar2 - 2] = (iVar4 + iVar7 >> 1) + iVar3;
    }
    else {
      iVar7 = iVar4 + iVar3;
    }
    __src[(ulong)uVar2 - 1] = iVar7;
    goto LAB_0010c77f;
  }
  return;
}

Assistant:

static void opj_idwt53_h(const opj_dwt_t *dwt,
                         OPJ_INT32* tiledp)
{
#ifdef STANDARD_SLOW_VERSION
    /* For documentation purpose */
    opj_dwt_interleave_h(dwt, tiledp);
    opj_dwt_decode_1(dwt);
    memcpy(tiledp, dwt->mem, (OPJ_UINT32)(dwt->sn + dwt->dn) * sizeof(OPJ_INT32));
#else
    const OPJ_INT32 sn = dwt->sn;
    const OPJ_INT32 len = sn + dwt->dn;
    if (dwt->cas == 0) { /* Left-most sample is on even coordinate */
        if (len > 1) {
            opj_idwt53_h_cas0(dwt->mem, sn, len, tiledp);
        } else {
            /* Unmodified value */
        }
    } else { /* Left-most sample is on odd coordinate */
        if (len == 1) {
            tiledp[0] /= 2;
        } else if (len == 2) {
            OPJ_INT32* out = dwt->mem;
            const OPJ_INT32* in_even = &tiledp[sn];
            const OPJ_INT32* in_odd = &tiledp[0];
            out[1] = in_odd[0] - ((in_even[0] + 1) >> 1);
            out[0] = in_even[0] + out[1];
            memcpy(tiledp, dwt->mem, (OPJ_UINT32)len * sizeof(OPJ_INT32));
        } else if (len > 2) {
            opj_idwt53_h_cas1(dwt->mem, sn, len, tiledp);
        }
    }
#endif
}